

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O1

int __thiscall bhf::ads::LicenseAccess::ShowSystemId(LicenseAccess *this,ostream *os)

{
  byte *buffer;
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  value_type_conflict2 *__val;
  uint uVar4;
  uint32_t bytesRead;
  string local_1d8;
  char buf [38];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  buffer = (byte *)operator_new(0x10);
  buffer[0] = 0;
  buffer[1] = 0;
  buffer[2] = 0;
  buffer[3] = 0;
  buffer[4] = 0;
  buffer[5] = 0;
  buffer[6] = 0;
  buffer[7] = 0;
  buffer[8] = 0;
  buffer[9] = 0;
  buffer[10] = 0;
  buffer[0xb] = 0;
  buffer[0xc] = 0;
  buffer[0xd] = 0;
  buffer[0xe] = 0;
  buffer[0xf] = 0;
  bytesRead = 0;
  lVar1 = AdsDevice::ReadReqEx2(&this->device,0x1010004,1,0x10,buffer,&bytesRead);
  if (lVar1 == 0) {
    snprintf(buf,0x26,"%02X%02X%02X%02X-%02X%02X-%02X%02X-%02X%02X-%02X%02X%02X%02X%02X%02X\n",
             (ulong)buffer[3],(ulong)buffer[2],(ulong)buffer[1],(ulong)*buffer,(ulong)buffer[5],
             (ulong)buffer[4],(ulong)buffer[7],(ulong)buffer[6],(ulong)buffer[8],(ulong)buffer[9],
             (ulong)buffer[10],(ulong)buffer[0xb],(ulong)buffer[0xc],(ulong)buffer[0xd],
             (ulong)buffer[0xe],(ulong)buffer[0xf]);
    sVar3 = strlen(buf);
    std::__ostream_insert<char,std::char_traits<char>>(os,buf,sVar3);
    uVar4 = (uint)(*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) != 0);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)buf);
    poVar2 = (ostream *)(buf + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"ShowSystemId",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(): failed with: 0x",0x13);
    *(uint *)((long)auStack_190 + *(long *)(buf._16_8_ + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(buf._16_8_ + -0x18)) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    local_1d8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d8,1);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
        &local_1d8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_));
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)buf);
    std::ios_base::~ios_base(local_138);
    uVar4 = 1;
  }
  operator_delete(buffer);
  return uVar4;
}

Assistant:

int LicenseAccess::ShowSystemId(std::ostream& os) const
{
    std::vector<uint8_t> readBuffer(16);
    uint32_t bytesRead = 0;
    const auto status = device.ReadReqEx2(0x01010004,
                                          0x1,
                                          readBuffer.size(),
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return 1;
    }
    char buf[38];
    snprintf(buf, sizeof(buf), "%02X%02X%02X%02X-%02X%02X-%02X%02X-%02X%02X-%02X%02X%02X%02X%02X%02X\n"
             , readBuffer[3], readBuffer[2], readBuffer[1], readBuffer[0]
             , readBuffer[5], readBuffer[4]
             , readBuffer[7], readBuffer[6]
             , readBuffer[8], readBuffer[9]
             , readBuffer[10], readBuffer[11], readBuffer[12], readBuffer[13], readBuffer[14], readBuffer[15]
             );
    os << buf;
    return !os.good();
}